

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O0

float Gia_IffObjTimeOne(Iff_Man_t *p,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  float fVar2;
  int *piVar3;
  float local_30;
  float DelayMax;
  int iFanin;
  int i;
  int iFaninSkip3_local;
  int iFaninSkip2_local;
  int iObj_local;
  Iff_Man_t *p_local;
  
  local_30 = -1e+09;
  for (DelayMax = 0.0; iVar1 = Gia_ObjLutSize(p->pGia,iObj), (int)DelayMax < iVar1;
      DelayMax = (float)((int)DelayMax + 1)) {
    piVar3 = Gia_ObjLutFanins(p->pGia,iObj);
    iVar1 = piVar3[(int)DelayMax];
    if (((iVar1 != iFaninSkip2) && (iVar1 != iFaninSkip3)) &&
       (fVar2 = Iff_ObjTimeId(p,iVar1), local_30 < fVar2)) {
      local_30 = Iff_ObjTimeId(p,iVar1);
    }
  }
  fVar2 = (float)Gia_ObjLutSize(p->pGia,iObj);
  if (DelayMax != fVar2) {
    __assert_fail("i == Gia_ObjLutSize(p->pGia, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                  ,0x97,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
  }
  if (iFaninSkip2 == -1) {
    p_local._4_4_ = local_30;
  }
  else {
    for (DelayMax = 0.0; iVar1 = Gia_ObjLutSize(p->pGia,iFaninSkip2), (int)DelayMax < iVar1;
        DelayMax = (float)((int)DelayMax + 1)) {
      piVar3 = Gia_ObjLutFanins(p->pGia,iFaninSkip2);
      iVar1 = piVar3[(int)DelayMax];
      if ((iVar1 != iFaninSkip3) && (fVar2 = Iff_ObjTimeId(p,iVar1), local_30 < fVar2)) {
        local_30 = Iff_ObjTimeId(p,iVar1);
      }
    }
    if (iFaninSkip3 == -1) {
      p_local._4_4_ = local_30;
    }
    else {
      for (DelayMax = 0.0; iVar1 = Gia_ObjLutSize(p->pGia,iFaninSkip3), (int)DelayMax < iVar1;
          DelayMax = (float)((int)DelayMax + 1)) {
        piVar3 = Gia_ObjLutFanins(p->pGia,iFaninSkip3);
        iVar1 = piVar3[(int)DelayMax];
        if ((iVar1 != iFaninSkip2) && (fVar2 = Iff_ObjTimeId(p,iVar1), local_30 < fVar2)) {
          local_30 = Iff_ObjTimeId(p,iVar1);
        }
      }
      if (local_30 < 0.0) {
        __assert_fail("DelayMax >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                      ,0xa2,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
      }
      p_local._4_4_ = local_30;
    }
  }
  return p_local._4_4_;
}

Assistant:

float Gia_IffObjTimeOne( Iff_Man_t * p, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin;
    float DelayMax = -ABC_INFINITY;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
        if ( iFanin != iFaninSkip2 && iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( i == Gia_ObjLutSize(p->pGia, iObj) );
    if ( iFaninSkip2 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip2, iFanin, i )
        if ( iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    if ( iFaninSkip3 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip3, iFanin, i )
        if ( iFanin != iFaninSkip2 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( DelayMax >= 0 );
    return DelayMax;
}